

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O0

void __thiscall FIX::DateTime::setSecond(DateTime *this,int sec)

{
  int local_24;
  int local_20;
  int millis;
  int old_sec;
  int min;
  int hour;
  int sec_local;
  DateTime *this_local;
  
  min = sec;
  _hour = this;
  getHMS(this,&old_sec,&millis,&local_20,&local_24);
  setHMS(this,old_sec,millis,min,local_24);
  return;
}

Assistant:

void setSecond(int sec) {
    int hour, min, old_sec, millis;
    getHMS(hour, min, old_sec, millis);
    setHMS(hour, min, sec, millis);
  }